

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.h
# Opt level: O0

void __thiscall
TPZSkylMatrix<std::complex<double>_>::~TPZSkylMatrix
          (TPZSkylMatrix<std::complex<double>_> *this,void **vtt)

{
  undefined8 *in_RSI;
  TPZVec<std::complex<double>_> *in_RDI;
  void **in_stack_ffffffffffffffd8;
  
  in_RDI->_vptr_TPZVec = (_func_int **)*in_RSI;
  (*in_RDI->_vptr_TPZVec[0x4e])();
  TPZVec<std::complex<double>_>::~TPZVec(in_RDI);
  TPZVec<std::complex<double>_*>::~TPZVec((TPZVec<std::complex<double>_*> *)in_RDI);
  TPZMatrix<std::complex<double>_>::~TPZMatrix
            ((TPZMatrix<std::complex<double>_> *)in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

virtual ~TPZSkylMatrix() { Clear(); }